

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O1

err_t dstuPointVal(dstu_params *params,octet *point)

{
  qr_o *pqVar1;
  size_t sVar2;
  ec_o *ec_00;
  err_t eVar3;
  bool_t bVar4;
  word *stack;
  word *a;
  ec_o *ec;
  ec_o *local_38;
  
  local_38 = (ec_o *)0x0;
  eVar3 = dstuEcCreate(&local_38,params,dstuPointVal_deep);
  ec_00 = local_38;
  if (eVar3 != 0) {
    return eVar3;
  }
  bVar4 = memIsValid(point,local_38->f->no * 2);
  if (bVar4 == 0) {
    blobClose(ec_00);
    return 0x6d;
  }
  a = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
  pqVar1 = ec_00->f;
  sVar2 = pqVar1->n;
  stack = a + sVar2 + sVar2;
  bVar4 = (*pqVar1->from)(a,point,pqVar1,stack);
  if (bVar4 != 0) {
    pqVar1 = ec_00->f;
    bVar4 = (*pqVar1->from)(a + sVar2,point + pqVar1->no,pqVar1,stack);
    if ((bVar4 != 0) && (bVar4 = ec2IsOnA(a,ec_00,stack), bVar4 != 0)) {
      bVar4 = ecHasOrderA(a,ec_00,ec_00->order,ec_00->f->n,stack);
      eVar3 = 0;
      if (bVar4 != 0) goto LAB_00140dd3;
    }
  }
  eVar3 = 0x191;
LAB_00140dd3:
  blobClose(ec_00);
  return eVar3;
}

Assistant:

err_t dstuPointVal(const dstu_params* params, const octet point[])
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	word* x;
	word* y;
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuPointVal_deep);
	ERR_CALL_CHECK(code);
	// проверить входные указатели
	if (!memIsValid(point, 2 * ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	x = objEnd(ec, word);
	y = x + ec->f->n;
	stack = y + ec->f->n;
	// (x, y) лежит на ЭК? (x, y) имеет порядок order?
	if (!qrFrom(x, point, ec->f, stack) ||
		!qrFrom(y, point + ec->f->no, ec->f, stack) ||
		!ec2IsOnA(x, ec, stack) ||
		!ecHasOrderA(x, ec, ec->order, ec->f->n, stack))
		code = ERR_BAD_POINT;
	// завершение
	dstuEcClose(ec);
	return code;
}